

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O1

Error asmjit::x86::FormatterInternal_formatImmBits
                (String *sb,uint32_t u8,ImmBits *bits,uint32_t count)

{
  uint id;
  Error EVar1;
  char *__s;
  ulong uVar2;
  Error unaff_EBP;
  int iVar3;
  int iVar4;
  char *__format;
  bool bVar5;
  char buf [64];
  
  __format = bits->text;
  iVar4 = 0;
  for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
    id = (((ImmBits *)(__format + -3))->mask & u8) >> (__format[-2] & 0x1fU);
    if (__format[-1] == '\x01') {
      __s = buf;
      snprintf(__s,0x40,__format,(ulong)id);
LAB_00131645:
      if (*__s == '\0') {
        bVar5 = false;
      }
      else {
        iVar3 = iVar4 + 1;
        EVar1 = String::append(sb,'|' - (iVar4 == 0));
        iVar4 = iVar3;
        if (EVar1 == 0) {
          EVar1 = String::append(sb,__s,0xffffffffffffffff);
          bVar5 = EVar1 != 0;
          if (bVar5) {
            unaff_EBP = EVar1;
          }
        }
        else {
          bVar5 = true;
          unaff_EBP = EVar1;
        }
      }
    }
    else {
      if (__format[-1] == '\0') {
        __s = Support::findPackedString(__format,id);
        goto LAB_00131645;
      }
      bVar5 = true;
      unaff_EBP = 3;
    }
    if (bVar5) break;
    __format = __format + 0x30;
  }
  if ((count <= uVar2) && ((iVar4 == 0 || (unaff_EBP = String::append(sb,'}'), unaff_EBP == 0)))) {
    unaff_EBP = 0;
  }
  return unaff_EBP;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error FormatterInternal_formatImmBits(String& sb, uint32_t u8, const ImmBits* bits, uint32_t count) noexcept {
  uint32_t n = 0;
  char buf[64];

  for (uint32_t i = 0; i < count; i++) {
    const ImmBits& spec = bits[i];

    uint32_t value = (u8 & uint32_t(spec.mask)) >> spec.shift;
    const char* str = nullptr;

    switch (spec.mode) {
      case ImmBits::kModeLookup:
        str = Support::findPackedString(spec.text, value);
        break;

      case ImmBits::kModeFormat:
        snprintf(buf, sizeof(buf), spec.text, unsigned(value));
        str = buf;
        break;

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    if (!str[0])
      continue;

    ASMJIT_PROPAGATE(sb.append(++n == 1 ? kImmCharStart : kImmCharOr));
    ASMJIT_PROPAGATE(sb.append(str));
  }

  if (n && kImmCharEnd)
    ASMJIT_PROPAGATE(sb.append(kImmCharEnd));

  return kErrorOk;
}